

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void __thiscall
el::base::debug::StackTrace::StackTraceEntry::StackTraceEntry
          (StackTraceEntry *this,size_t index,char *loc,char *demang,char *hex,char *addr)

{
  allocator local_89;
  string *local_88;
  string *local_80;
  string *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  string *local_38;
  
  local_40 = &(this->m_location).field_2;
  (this->m_location)._M_dataplus._M_p = (pointer)local_40;
  (this->m_location)._M_string_length = 0;
  (this->m_location).field_2._M_local_buf[0] = '\0';
  local_78 = (string *)&this->m_demangled;
  local_48 = &(this->m_demangled).field_2;
  (this->m_demangled)._M_dataplus._M_p = (pointer)local_48;
  (this->m_demangled)._M_string_length = 0;
  (this->m_demangled).field_2._M_local_buf[0] = '\0';
  local_80 = (string *)&this->m_hex;
  local_50 = &(this->m_hex).field_2;
  (this->m_hex)._M_dataplus._M_p = (pointer)local_50;
  (this->m_hex)._M_string_length = 0;
  (this->m_hex).field_2._M_local_buf[0] = '\0';
  local_88 = (string *)&this->m_addr;
  (this->m_addr)._M_dataplus._M_p = (pointer)&(this->m_addr).field_2;
  (this->m_addr)._M_string_length = 0;
  (this->m_addr).field_2._M_local_buf[0] = '\0';
  this->m_index = index;
  local_38 = &this->m_location;
  std::__cxx11::string::string((string *)local_70,loc,&local_89);
  std::__cxx11::string::operator=((string *)&this->m_location,(string *)local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  std::__cxx11::string::string((string *)local_70,demang,&local_89);
  std::__cxx11::string::operator=(local_78,(string *)local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  std::__cxx11::string::string((string *)local_70,hex,&local_89);
  std::__cxx11::string::operator=(local_80,(string *)local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  std::__cxx11::string::string((string *)local_70,addr,&local_89);
  std::__cxx11::string::operator=(local_88,(string *)local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return;
}

Assistant:

StackTrace::StackTraceEntry::StackTraceEntry(std::size_t index, const char* loc, const char* demang, const char* hex,
    const char* addr) {
  m_index = index;
  m_location = std::string(loc);
  m_demangled = std::string(demang);
  m_hex = std::string(hex);
  m_addr = std::string(addr);
}